

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::AssignmentExpression::visitExprs<xilinx_do_not_care_values::MainVisitor&>
          (AssignmentExpression *this,AlwaysFFVisitor *visitor)

{
  if (this->timingControl != (TimingControl *)0x0) {
    TimingControl::visit<xilinx_do_not_care_values::MainVisitor>(this->timingControl,visitor);
  }
  Expression::visit<xilinx_do_not_care_values::MainVisitor&>(this->left_,visitor);
  Expression::visit<xilinx_do_not_care_values::MainVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (timingControl)
            timingControl->visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }